

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# red_black_tree.cpp
# Opt level: O2

void eastl::RBTreeInsert(rbtree_node_base *pNode,rbtree_node_base *pNodeParent,
                        rbtree_node_base *pNodeAnchor,RBTreeSide insertionSide)

{
  rbtree_node_base *pNode_00;
  rbtree_node_base *pNode_01;
  rbtree_node_base *prVar1;
  rbtree_node_base *prVar2;
  
  pNode->mpNodeParent = pNodeParent;
  pNode->mColor = '\0';
  pNode->mpNodeRight = (this_type *)0x0;
  pNode->mpNodeLeft = (this_type *)0x0;
  prVar1 = pNodeAnchor;
  if (insertionSide == kRBTreeSideLeft) {
    pNodeParent->mpNodeLeft = pNode;
    if (pNodeParent == pNodeAnchor) {
      pNodeAnchor->mpNodeParent = pNode;
    }
    else {
      if (pNodeAnchor->mpNodeLeft != pNodeParent) goto LAB_00106be6;
      prVar1 = (rbtree_node_base *)&pNodeAnchor->mpNodeLeft;
    }
  }
  else {
    pNodeParent->mpNodeRight = pNode;
    if (pNodeAnchor->mpNodeRight != pNodeParent) goto LAB_00106be6;
  }
  prVar1->mpNodeRight = pNode;
LAB_00106be6:
  prVar1 = pNodeAnchor->mpNodeParent;
  do {
    while( true ) {
      if ((pNode == prVar1) || (pNode_00 = pNode->mpNodeParent, pNode_00->mColor != '\0')) {
        prVar1->mColor = '\x01';
        return;
      }
      pNode_01 = pNode_00->mpNodeParent;
      prVar2 = pNode_01->mpNodeLeft;
      if (pNode_00 == prVar2) break;
      if ((prVar2 != (rbtree_node_base *)0x0) && (prVar2->mColor == '\0')) goto LAB_00106c39;
      prVar2 = pNode_00;
      if (pNode == pNode_00->mpNodeLeft) {
        prVar1 = RBTreeRotateRight(pNode_00,prVar1);
        pNodeAnchor->mpNodeParent = prVar1;
        prVar2 = pNode_00->mpNodeParent;
        pNode = pNode_00;
      }
      prVar2->mColor = '\x01';
      pNode_01->mColor = '\0';
      prVar1 = RBTreeRotateLeft(pNode_01,prVar1);
LAB_00106ca8:
      pNodeAnchor->mpNodeParent = prVar1;
    }
    prVar2 = pNode_01->mpNodeRight;
    if ((prVar2 == (rbtree_node_base *)0x0) || (prVar2->mColor != '\0')) {
      prVar2 = pNode_00;
      if (pNode == pNode_00->mpNodeRight) {
        prVar1 = RBTreeRotateLeft(pNode_00,prVar1);
        pNodeAnchor->mpNodeParent = prVar1;
        prVar2 = pNode_00->mpNodeParent;
        pNode = pNode_00;
      }
      prVar2->mColor = '\x01';
      pNode_01->mColor = '\0';
      prVar1 = RBTreeRotateRight(pNode_01,prVar1);
      goto LAB_00106ca8;
    }
LAB_00106c39:
    pNode_00->mColor = '\x01';
    prVar2->mColor = '\x01';
    pNode_01->mColor = '\0';
    pNode = pNode_01;
  } while( true );
}

Assistant:

EASTL_API void RBTreeInsert(rbtree_node_base* pNode,
                                rbtree_node_base* pNodeParent, 
                                rbtree_node_base* pNodeAnchor,
                                RBTreeSide insertionSide)
    {
        rbtree_node_base*& pNodeRootRef = pNodeAnchor->mpNodeParent;

        // Initialize fields in new node to insert.
        pNode->mpNodeParent = pNodeParent;
        pNode->mpNodeRight  = NULL;
        pNode->mpNodeLeft   = NULL;
        pNode->mColor       = kRBTreeColorRed;

        // Insert the node.
        if(insertionSide == kRBTreeSideLeft)
        {
            pNodeParent->mpNodeLeft = pNode; // Also makes (leftmost = pNode) when (pNodeParent == pNodeAnchor)

            if(pNodeParent == pNodeAnchor)
            {
                pNodeAnchor->mpNodeParent = pNode;
                pNodeAnchor->mpNodeRight = pNode;
            }
            else if(pNodeParent == pNodeAnchor->mpNodeLeft)
                pNodeAnchor->mpNodeLeft = pNode; // Maintain leftmost pointing to min node
        }
        else
        {
            pNodeParent->mpNodeRight = pNode;

            if(pNodeParent == pNodeAnchor->mpNodeRight)
                pNodeAnchor->mpNodeRight = pNode; // Maintain rightmost pointing to max node
        }

        // Rebalance the tree.
        while((pNode != pNodeRootRef) && (pNode->mpNodeParent->mColor == kRBTreeColorRed)) 
        {
            rbtree_node_base* const pNodeParentParent = pNode->mpNodeParent->mpNodeParent;

            if(pNode->mpNodeParent == pNodeParentParent->mpNodeLeft) 
            {
                rbtree_node_base* const pNodeTemp = pNodeParentParent->mpNodeRight;

                if(pNodeTemp && (pNodeTemp->mColor == kRBTreeColorRed)) 
                {
                    pNode->mpNodeParent->mColor = kRBTreeColorBlack;
                    pNodeTemp->mColor = kRBTreeColorBlack;
                    pNodeParentParent->mColor = kRBTreeColorRed;
                    pNode = pNodeParentParent;
                }
                else 
                {
                    if(pNode == pNode->mpNodeParent->mpNodeRight) 
                    {
                        pNode = pNode->mpNodeParent;
                        pNodeRootRef = RBTreeRotateLeft(pNode, pNodeRootRef);
                    }

                    pNode->mpNodeParent->mColor = kRBTreeColorBlack;
                    pNodeParentParent->mColor = kRBTreeColorRed;
                    pNodeRootRef = RBTreeRotateRight(pNodeParentParent, pNodeRootRef);
                }
            }
            else 
            {
                rbtree_node_base* const pNodeTemp = pNodeParentParent->mpNodeLeft;

                if(pNodeTemp && (pNodeTemp->mColor == kRBTreeColorRed)) 
                {
                    pNode->mpNodeParent->mColor = kRBTreeColorBlack;
                    pNodeTemp->mColor = kRBTreeColorBlack;
                    pNodeParentParent->mColor = kRBTreeColorRed;
                    pNode = pNodeParentParent;
                }
                else 
                {
                    if(pNode == pNode->mpNodeParent->mpNodeLeft) 
                    {
                        pNode = pNode->mpNodeParent;
                        pNodeRootRef = RBTreeRotateRight(pNode, pNodeRootRef);
                    }

                    pNode->mpNodeParent->mColor = kRBTreeColorBlack;
                    pNodeParentParent->mColor = kRBTreeColorRed;
                    pNodeRootRef = RBTreeRotateLeft(pNodeParentParent, pNodeRootRef);
                }
            }
        }

        pNodeRootRef->mColor = kRBTreeColorBlack;

    }